

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack1to8.h
# Opt level: O0

void ncnn::deconvolution_pack1to8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  long *plVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  int iVar67;
  int iVar68;
  undefined8 *puVar69;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _w;
  __m256 _val;
  int k;
  float val;
  int sx;
  int sxs;
  int x;
  float *sptr;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m256 _b;
  __m256 _a;
  __m256 max;
  __m256 min;
  __m256 neg;
  __m256 pos;
  __m256 one;
  __m256 one_7;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_1;
  __m256 one_2;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  __m256 two;
  __m256 one_4;
  __m256 one_5;
  __m256 pow2n_2;
  __m256 y_4;
  __m256 mask_3;
  __m256 one_6;
  __m256i imm0_3;
  __m256 fx_2;
  __m256 tmp_3;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  __m256 y_3;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_3;
  __m256i imm0_2;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  imm_xmm_union u_12;
  __m256i ret_5;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_5;
  __m128i x1_5;
  ulong uStack_4dd8;
  int local_4c3c;
  int local_4c24;
  int local_4bd4;
  long local_4b88;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  int local_4b4c;
  int local_4b48;
  undefined1 (*local_4ad8) [32];
  int local_4acc;
  float local_47a0;
  float fStack_479c;
  float fStack_4798;
  float fStack_4794;
  float fStack_4790;
  float fStack_478c;
  float fStack_4788;
  float fStack_4784;
  undefined1 local_46c0 [8];
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  ulong uStack_4638;
  float local_45e0;
  float fStack_45dc;
  float fStack_45d8;
  float fStack_45d4;
  float fStack_45d0;
  float fStack_45cc;
  float fStack_45c8;
  float fStack_45c4;
  float local_45a0;
  float fStack_459c;
  float fStack_4598;
  float fStack_4594;
  float fStack_4590;
  float fStack_458c;
  float fStack_4588;
  float local_4400;
  float fStack_43fc;
  float fStack_43f8;
  float fStack_43f4;
  float fStack_43f0;
  float fStack_43ec;
  float fStack_43e8;
  float fStack_43e4;
  float local_43e0;
  float fStack_43dc;
  float fStack_43d8;
  float fStack_43d4;
  float fStack_43d0;
  float fStack_43cc;
  float fStack_43c8;
  float local_43c0;
  float fStack_43bc;
  float fStack_43b8;
  float fStack_43b4;
  float fStack_43b0;
  float fStack_43ac;
  float fStack_43a8;
  float fStack_43a4;
  ulong uStack_4278;
  float local_4240;
  float fStack_423c;
  float fStack_4238;
  float fStack_4234;
  float fStack_4230;
  float fStack_422c;
  float fStack_4228;
  float fStack_4224;
  float local_41e0;
  float fStack_41dc;
  float fStack_41d8;
  float fStack_41d4;
  float fStack_41d0;
  float fStack_41cc;
  float fStack_41c8;
  float fStack_41c4;
  float local_41a0;
  float fStack_419c;
  float fStack_4198;
  float fStack_4194;
  float fStack_4190;
  float fStack_418c;
  float fStack_4188;
  float local_4180;
  float fStack_417c;
  float fStack_4178;
  float fStack_4174;
  float fStack_4170;
  float fStack_416c;
  float fStack_4168;
  undefined4 uStack_4164;
  undefined1 local_4120 [8];
  float fStack_4118;
  float fStack_4114;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  float local_4040;
  float fStack_403c;
  float fStack_4038;
  float fStack_4034;
  float fStack_4030;
  float fStack_402c;
  float fStack_4028;
  float fStack_4024;
  float local_4000;
  float fStack_3ffc;
  float fStack_3ff8;
  float fStack_3ff4;
  float fStack_3ff0;
  float fStack_3fec;
  float fStack_3fe8;
  float fStack_3fe4;
  float local_3fa0;
  float fStack_3f9c;
  float fStack_3f98;
  float fStack_3f94;
  float fStack_3f90;
  float fStack_3f8c;
  float fStack_3f88;
  undefined4 uStack_3f84;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined1 local_3bc0 [8];
  float fStack_3bb8;
  float fStack_3bb4;
  float fStack_3bb0;
  float fStack_3bac;
  float fStack_3ba8;
  undefined4 uStack_3ba4;
  undefined1 local_3b80 [16];
  float local_3680;
  float fStack_367c;
  float fStack_3678;
  float fStack_3674;
  float fStack_3670;
  float fStack_366c;
  float fStack_3668;
  float local_34e0;
  float fStack_34dc;
  float fStack_34d8;
  float fStack_34d4;
  float fStack_34d0;
  float fStack_34cc;
  float fStack_34c8;
  float local_3480;
  float fStack_347c;
  float fStack_3478;
  float fStack_3474;
  float fStack_3470;
  float fStack_346c;
  float fStack_3468;
  float fStack_3464;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined1 local_3340 [8];
  float fStack_3338;
  float fStack_3334;
  float fStack_3330;
  float fStack_332c;
  float fStack_3328;
  undefined4 uStack_3324;
  float local_2e00;
  float fStack_2dfc;
  float fStack_2df8;
  float fStack_2df4;
  float fStack_2df0;
  float fStack_2dec;
  float fStack_2de8;
  float local_2c60;
  float fStack_2c5c;
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float local_2c00;
  float fStack_2bfc;
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  float fStack_2be4;
  float local_28c0;
  float fStack_28bc;
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  float fStack_28a4;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  float local_2120;
  float fStack_211c;
  float fStack_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float fStack_2108;
  float local_2100;
  float fStack_20fc;
  float fStack_20f8;
  float fStack_20f4;
  float fStack_20f0;
  float fStack_20ec;
  float fStack_20e8;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  undefined4 uStack_20c4;
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  float fStack_2008;
  float fStack_2004;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined1 local_1e40 [8];
  float fStack_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  float fStack_1e28;
  undefined4 uStack_1e24;
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float local_1700;
  float fStack_16fc;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined1 local_10a0 [8];
  float fStack_1098;
  float fStack_1094;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined1 local_1020 [8];
  float fStack_1018;
  float fStack_1014;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined8 local_140;
  undefined8 uStack_138;
  
  lVar63 = in_RSI[7];
  lVar4 = *in_RCX;
  for (local_4acc = 0; local_4acc < (int)lVar63; local_4acc = local_4acc + 1) {
    local_4ad8 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_4acc * in_RSI[2]);
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    lVar64 = in_RDI[6];
    lVar65 = in_RDI[7];
    iVar3 = *(int *)((long)in_RSI + 0x2c);
    lVar66 = in_RSI[6];
    for (local_4b48 = 0; local_4b48 < (int)lVar66; local_4b48 = local_4b48 + 1) {
      for (local_4b4c = 0; local_4b4c < iVar3; local_4b4c = local_4b4c + 1) {
        local_4b80 = 0;
        uStack_4b78 = 0;
        uStack_4b70 = 0;
        uStack_4b68 = 0;
        if (lVar4 != 0) {
          puVar69 = (undefined8 *)(lVar4 + (long)(local_4acc << 3) * 4);
          local_4b80 = *puVar69;
          uStack_4b78 = puVar69[1];
          uStack_4b70 = puVar69[2];
          uStack_4b68 = puVar69[3];
        }
        local_4b88 = *in_RDX + in_RDX[8] * (long)local_4acc * in_RDX[2];
        for (local_4bd4 = 0; local_4bd4 < (int)lVar65; local_4bd4 = local_4bd4 + 1) {
          for (local_4c24 = 0; local_4c24 < in_R9D; local_4c24 = local_4c24 + 1) {
            iVar67 = (local_4b48 + local_4c24 * dilation_w) - dilation_w * (in_R9D + -1);
            if (((-1 < iVar67) && (iVar67 % stride_w == 0)) && (iVar67 / stride_w < (int)lVar64)) {
              for (local_4c3c = 0; local_4c3c < in_R8D; local_4c3c = local_4c3c + 1) {
                iVar68 = (local_4b4c + local_4c3c * in_stack_00000008) -
                         in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar68) && (iVar68 % dilation_h == 0)) && (iVar68 / dilation_h < iVar2))
                {
                  uVar1 = *(uint *)(*in_RDI + in_RDI[8] * (long)local_4bd4 * in_RDI[2] +
                                    (long)*(int *)((long)in_RDI + 0x2c) * (long)(iVar67 / stride_w)
                                    * in_RDI[2] + (long)(iVar68 / dilation_h) * 4);
                  auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
                  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
                  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
                  auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
                  auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
                  auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
                  puVar69 = (undefined8 *)
                            (local_4b88 + (long)((local_4c24 * in_R8D + local_4c3c) * 8) * 4);
                  local_47a0 = auVar6._0_4_;
                  fStack_479c = auVar6._4_4_;
                  fStack_4798 = auVar6._8_4_;
                  fStack_4794 = auVar6._12_4_;
                  fStack_4790 = auVar5._0_4_;
                  fStack_478c = auVar5._4_4_;
                  fStack_4788 = auVar5._8_4_;
                  fStack_4784 = auVar5._12_4_;
                  local_45a0 = (float)*puVar69;
                  fStack_459c = (float)((ulong)*puVar69 >> 0x20);
                  fStack_4598 = (float)puVar69[1];
                  fStack_4594 = (float)((ulong)puVar69[1] >> 0x20);
                  fStack_4590 = (float)puVar69[2];
                  fStack_458c = (float)((ulong)puVar69[2] >> 0x20);
                  fStack_4588 = (float)puVar69[3];
                  local_45e0 = (float)local_4b80;
                  fStack_45dc = (float)((ulong)local_4b80 >> 0x20);
                  fStack_45d8 = (float)uStack_4b78;
                  fStack_45d4 = (float)((ulong)uStack_4b78 >> 0x20);
                  fStack_45d0 = (float)uStack_4b70;
                  fStack_45cc = (float)((ulong)uStack_4b70 >> 0x20);
                  fStack_45c8 = (float)uStack_4b68;
                  fStack_45c4 = (float)((ulong)uStack_4b68 >> 0x20);
                  local_4b80 = CONCAT44(fStack_479c * fStack_459c + fStack_45dc,
                                        local_47a0 * local_45a0 + local_45e0);
                  uStack_4b78 = CONCAT44(fStack_4794 * fStack_4594 + fStack_45d4,
                                         fStack_4798 * fStack_4598 + fStack_45d8);
                  uStack_4b70 = CONCAT44(fStack_478c * fStack_458c + fStack_45cc,
                                         fStack_4790 * fStack_4590 + fStack_45d0);
                  uStack_4b68 = CONCAT44(fStack_4784 + fStack_45c4,
                                         fStack_4788 * fStack_4588 + fStack_45c8);
                }
              }
            }
          }
          local_4b88 = local_4b88 + (long)(in_R8D * in_R9D * 8) * 4;
        }
        plVar15 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_4180 = (float)local_4b80;
        fStack_417c = (float)((ulong)local_4b80 >> 0x20);
        fStack_4178 = (float)uStack_4b78;
        fStack_4174 = (float)((ulong)uStack_4b78 >> 0x20);
        fStack_4170 = (float)uStack_4b70;
        fStack_416c = (float)((ulong)uStack_4b70 >> 0x20);
        fStack_4168 = (float)uStack_4b68;
        switch(stride_h) {
        case 1:
          uStack_4638 = SUB328(ZEXT832(0),4);
          auVar16._8_8_ = uStack_4b78;
          auVar16._0_8_ = local_4b80;
          auVar16._16_8_ = uStack_4b70;
          auVar16._24_8_ = uStack_4b68;
          _local_46c0 = vmaxps_avx(auVar16,ZEXT832(uStack_4638) << 0x40);
          break;
        case 2:
          uVar1 = *(uint *)*plVar15;
          auVar19._8_8_ = uStack_4b78;
          auVar19._0_8_ = local_4b80;
          auVar19._16_8_ = uStack_4b70;
          auVar19._24_8_ = uStack_4b68;
          auVar12 = vmaxps_avx(ZEXT832(0),auVar19);
          auVar20._8_8_ = uStack_4b78;
          auVar20._0_8_ = local_4b80;
          auVar20._16_8_ = uStack_4b70;
          auVar20._24_8_ = uStack_4b68;
          auVar11 = vminps_avx(ZEXT832(0),auVar20);
          auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
          auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
          local_43c0 = auVar6._0_4_;
          fStack_43bc = auVar6._4_4_;
          fStack_43b8 = auVar6._8_4_;
          fStack_43b4 = auVar6._12_4_;
          fStack_43b0 = auVar5._0_4_;
          fStack_43ac = auVar5._4_4_;
          fStack_43a8 = auVar5._8_4_;
          fStack_43a4 = auVar5._12_4_;
          local_43e0 = auVar11._0_4_;
          fStack_43dc = auVar11._4_4_;
          fStack_43d8 = auVar11._8_4_;
          fStack_43d4 = auVar11._12_4_;
          fStack_43d0 = auVar11._16_4_;
          fStack_43cc = auVar11._20_4_;
          fStack_43c8 = auVar11._24_4_;
          local_4400 = auVar12._0_4_;
          fStack_43fc = auVar12._4_4_;
          fStack_43f8 = auVar12._8_4_;
          fStack_43f4 = auVar12._12_4_;
          fStack_43f0 = auVar12._16_4_;
          fStack_43ec = auVar12._20_4_;
          fStack_43e8 = auVar12._24_4_;
          fStack_43e4 = auVar12._28_4_;
          local_46c0._4_4_ = fStack_43fc + fStack_43bc * fStack_43dc;
          local_46c0._0_4_ = local_4400 + local_43c0 * local_43e0;
          uStack_46b8._0_4_ = fStack_43f8 + fStack_43b8 * fStack_43d8;
          uStack_46b8._4_4_ = fStack_43f4 + fStack_43b4 * fStack_43d4;
          uStack_46b0._0_4_ = fStack_43f0 + fStack_43b0 * fStack_43d0;
          uStack_46b0._4_4_ = fStack_43ec + fStack_43ac * fStack_43cc;
          uStack_46a8._0_4_ = fStack_43e8 + fStack_43a8 * fStack_43c8;
          uStack_46a8._4_4_ = fStack_43e4 + fStack_43a4;
          break;
        case 3:
          uVar1 = *(uint *)*plVar15;
          auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
          auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
          uStack_3d50 = auVar6._0_8_;
          uStack_3d48 = auVar6._8_8_;
          uVar1 = *(uint *)(*plVar15 + 4);
          auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
          auVar7 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x30);
          uStack_3d10 = auVar6._0_8_;
          uStack_3d08 = auVar6._8_8_;
          auVar18._8_8_ = uStack_4b78;
          auVar18._0_8_ = local_4b80;
          auVar18._16_8_ = uStack_4b70;
          auVar18._24_8_ = uStack_4b68;
          auVar17._16_8_ = uStack_3d50;
          auVar17._0_16_ = auVar5;
          auVar17._24_8_ = uStack_3d48;
          auVar12 = vmaxps_avx(auVar18,auVar17);
          auVar21._16_8_ = uStack_3d10;
          auVar21._0_16_ = auVar7;
          auVar21._24_8_ = uStack_3d08;
          _local_46c0 = vminps_avx(auVar12,auVar21);
          break;
        case 4:
          auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          uStack_3e50 = auVar6._0_8_;
          uStack_3e48 = auVar6._8_8_;
          uStack_4278 = SUB328(ZEXT832(0),4);
          auVar27._8_8_ = uStack_4b78;
          auVar27._0_8_ = local_4b80;
          auVar27._16_8_ = uStack_4b70;
          auVar27._24_8_ = uStack_4b68;
          auVar12 = vsubps_avx(ZEXT832(uStack_4278) << 0x40,auVar27);
          auVar26._8_8_ = 0x42b0c0a542b0c0a5;
          auVar26._0_8_ = 0x42b0c0a542b0c0a5;
          auVar26._16_8_ = 0x42b0c0a542b0c0a5;
          auVar26._24_8_ = 0x42b0c0a542b0c0a5;
          auVar12 = vminps_avx(auVar12,auVar26);
          auVar25._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar25._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar25._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar25._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar11 = vmaxps_avx(auVar12,auVar25);
          local_2e00 = auVar11._0_4_;
          fStack_2dfc = auVar11._4_4_;
          fStack_2df8 = auVar11._8_4_;
          fStack_2df4 = auVar11._12_4_;
          fStack_2df0 = auVar11._16_4_;
          fStack_2dec = auVar11._20_4_;
          fStack_2de8 = auVar11._24_4_;
          local_3340._4_4_ = fStack_2dfc * 1.442695 + 0.5;
          local_3340._0_4_ = local_2e00 * 1.442695 + 0.5;
          fStack_3338 = fStack_2df8 * 1.442695 + 0.5;
          fStack_3334 = fStack_2df4 * 1.442695 + 0.5;
          fStack_3330 = fStack_2df0 * 1.442695 + 0.5;
          fStack_332c = fStack_2dec * 1.442695 + 0.5;
          fStack_3328 = fStack_2de8 * 1.442695 + 0.5;
          uStack_3324 = 0x3ff8aa3b;
          auVar14 = vroundps_avx(_local_3340,1);
          auVar12 = vcmpps_avx(_local_3340,auVar14,1);
          auVar28._8_8_ = 0x3f8000003f800000;
          auVar28._0_8_ = 0x3f8000003f800000;
          auVar28._16_8_ = 0x3f8000003f800000;
          auVar28._24_8_ = 0x3f8000003f800000;
          auVar12 = vandps_avx(auVar12,auVar28);
          auVar12 = vsubps_avx(auVar14,auVar12);
          local_28c0 = auVar12._0_4_;
          fStack_28bc = auVar12._4_4_;
          fStack_28b8 = auVar12._8_4_;
          fStack_28b4 = auVar12._12_4_;
          fStack_28b0 = auVar12._16_4_;
          fStack_28ac = auVar12._20_4_;
          fStack_28a8 = auVar12._24_4_;
          fStack_28a4 = auVar12._28_4_;
          auVar31._4_4_ = fStack_28bc * 0.6933594;
          auVar31._0_4_ = local_28c0 * 0.6933594;
          auVar31._8_4_ = fStack_28b8 * 0.6933594;
          auVar31._12_4_ = fStack_28b4 * 0.6933594;
          auVar31._16_4_ = fStack_28b0 * 0.6933594;
          auVar31._20_4_ = fStack_28ac * 0.6933594;
          auVar31._24_4_ = fStack_28a8 * 0.6933594;
          auVar31._28_4_ = fStack_28a4;
          auVar12 = vsubps_avx(auVar11,auVar31);
          auVar30._4_4_ = fStack_28bc * -0.00021219444;
          auVar30._0_4_ = local_28c0 * -0.00021219444;
          auVar30._8_4_ = fStack_28b8 * -0.00021219444;
          auVar30._12_4_ = fStack_28b4 * -0.00021219444;
          auVar30._16_4_ = fStack_28b0 * -0.00021219444;
          auVar30._20_4_ = fStack_28ac * -0.00021219444;
          auVar30._24_4_ = fStack_28a8 * -0.00021219444;
          auVar30._28_4_ = fStack_28a4;
          auVar12 = vsubps_avx(auVar12,auVar30);
          local_2c00 = auVar12._0_4_;
          fStack_2bfc = auVar12._4_4_;
          fStack_2bf8 = auVar12._8_4_;
          fStack_2bf4 = auVar12._12_4_;
          fStack_2bf0 = auVar12._16_4_;
          fStack_2bec = auVar12._20_4_;
          fStack_2be8 = auVar12._24_4_;
          fStack_2be4 = auVar12._28_4_;
          local_3360 = CONCAT44((int)fStack_28bc,(int)local_28c0);
          uStack_3358 = CONCAT44((int)fStack_28b4,(int)fStack_28b8);
          uStack_3350 = CONCAT44((int)fStack_28ac,(int)fStack_28b0);
          uStack_3348 = CONCAT44((int)fStack_28a4,(int)fStack_28a8);
          auVar37._8_8_ = uStack_3358;
          auVar37._0_8_ = local_3360;
          auVar36._8_8_ = 0x7f0000007f;
          auVar36._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar37,auVar36);
          auVar35._8_8_ = uStack_3348;
          auVar35._0_8_ = uStack_3350;
          auVar34._8_8_ = 0x7f0000007f;
          auVar34._0_8_ = 0x7f0000007f;
          auVar8 = vpaddd_avx(auVar35,auVar34);
          auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
          auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
          local_2c60 = auVar7._0_4_;
          fStack_2c5c = auVar7._4_4_;
          fStack_2c58 = auVar7._8_4_;
          fStack_2c54 = auVar7._12_4_;
          fStack_2c50 = auVar8._0_4_;
          fStack_2c4c = auVar8._4_4_;
          fStack_2c48 = auVar8._8_4_;
          local_4240 = auVar5._0_4_;
          fStack_423c = auVar5._4_4_;
          fStack_4238 = auVar5._8_4_;
          fStack_4234 = auVar5._12_4_;
          fStack_4230 = auVar6._0_4_;
          fStack_422c = auVar6._4_4_;
          fStack_4228 = auVar6._8_4_;
          fStack_4224 = auVar6._12_4_;
          auVar23._16_8_ = uStack_3e50;
          auVar23._0_16_ = auVar5;
          auVar23._24_8_ = uStack_3e48;
          auVar22._4_4_ =
               fStack_423c +
               ((((((fStack_2bfc * 0.00019875691 + 0.0013981999) * fStack_2bfc + 0.008333452) *
                   fStack_2bfc + 0.041665796) * fStack_2bfc + 0.16666666) * fStack_2bfc + 0.5) *
                fStack_2bfc * fStack_2bfc + fStack_2bfc + 1.0) * fStack_2c5c;
          auVar22._0_4_ =
               local_4240 +
               ((((((local_2c00 * 0.00019875691 + 0.0013981999) * local_2c00 + 0.008333452) *
                   local_2c00 + 0.041665796) * local_2c00 + 0.16666666) * local_2c00 + 0.5) *
                local_2c00 * local_2c00 + local_2c00 + 1.0) * local_2c60;
          auVar22._8_4_ =
               fStack_4238 +
               ((((((fStack_2bf8 * 0.00019875691 + 0.0013981999) * fStack_2bf8 + 0.008333452) *
                   fStack_2bf8 + 0.041665796) * fStack_2bf8 + 0.16666666) * fStack_2bf8 + 0.5) *
                fStack_2bf8 * fStack_2bf8 + fStack_2bf8 + 1.0) * fStack_2c58;
          auVar22._12_4_ =
               fStack_4234 +
               ((((((fStack_2bf4 * 0.00019875691 + 0.0013981999) * fStack_2bf4 + 0.008333452) *
                   fStack_2bf4 + 0.041665796) * fStack_2bf4 + 0.16666666) * fStack_2bf4 + 0.5) *
                fStack_2bf4 * fStack_2bf4 + fStack_2bf4 + 1.0) * fStack_2c54;
          auVar22._16_4_ =
               fStack_4230 +
               ((((((fStack_2bf0 * 0.00019875691 + 0.0013981999) * fStack_2bf0 + 0.008333452) *
                   fStack_2bf0 + 0.041665796) * fStack_2bf0 + 0.16666666) * fStack_2bf0 + 0.5) *
                fStack_2bf0 * fStack_2bf0 + fStack_2bf0 + 1.0) * fStack_2c50;
          auVar22._20_4_ =
               fStack_422c +
               ((((((fStack_2bec * 0.00019875691 + 0.0013981999) * fStack_2bec + 0.008333452) *
                   fStack_2bec + 0.041665796) * fStack_2bec + 0.16666666) * fStack_2bec + 0.5) *
                fStack_2bec * fStack_2bec + fStack_2bec + 1.0) * fStack_2c4c;
          auVar22._24_4_ =
               fStack_4228 +
               ((((((fStack_2be8 * 0.00019875691 + 0.0013981999) * fStack_2be8 + 0.008333452) *
                   fStack_2be8 + 0.041665796) * fStack_2be8 + 0.16666666) * fStack_2be8 + 0.5) *
                fStack_2be8 * fStack_2be8 + fStack_2be8 + 1.0) * fStack_2c48;
          auVar22._28_4_ = fStack_4224 + fStack_2be4 + fStack_2be4 + 1.0;
          _local_46c0 = vdivps_avx(auVar23,auVar22);
          break;
        case 5:
          local_3b80._8_8_ = uStack_4b78;
          local_3b80._0_8_ = local_4b80;
          auVar24._16_8_ = uStack_4b70;
          auVar24._0_16_ = local_3b80;
          auVar24._24_8_ = uStack_4b68;
          auVar13._8_8_ = 0x42b0c0a542b0c0a5;
          auVar13._0_8_ = 0x42b0c0a542b0c0a5;
          auVar13._16_8_ = 0x42b0c0a542b0c0a5;
          auVar13._24_8_ = 0x42b0c0a542b0c0a5;
          auVar12 = vminps_avx(auVar24,auVar13);
          auVar14._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar14._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar14._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar14._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar11 = vmaxps_avx(auVar12,auVar14);
          local_3680 = auVar11._0_4_;
          fStack_367c = auVar11._4_4_;
          fStack_3678 = auVar11._8_4_;
          fStack_3674 = auVar11._12_4_;
          fStack_3670 = auVar11._16_4_;
          fStack_366c = auVar11._20_4_;
          fStack_3668 = auVar11._24_4_;
          local_3bc0._4_4_ = fStack_367c * 1.442695 + 0.5;
          local_3bc0._0_4_ = local_3680 * 1.442695 + 0.5;
          fStack_3bb8 = fStack_3678 * 1.442695 + 0.5;
          fStack_3bb4 = fStack_3674 * 1.442695 + 0.5;
          fStack_3bb0 = fStack_3670 * 1.442695 + 0.5;
          fStack_3bac = fStack_366c * 1.442695 + 0.5;
          fStack_3ba8 = fStack_3668 * 1.442695 + 0.5;
          uStack_3ba4 = 0x3ff8aa3b;
          auVar14 = vroundps_avx(_local_3bc0,1);
          auVar12 = vcmpps_avx(_local_3bc0,auVar14,1);
          auVar29._8_8_ = 0x3f8000003f800000;
          auVar29._0_8_ = 0x3f8000003f800000;
          auVar29._16_8_ = 0x3f8000003f800000;
          auVar29._24_8_ = 0x3f8000003f800000;
          auVar12 = vandps_avx(auVar12,auVar29);
          auVar12 = vsubps_avx(auVar14,auVar12);
          local_2700 = auVar12._0_4_;
          fStack_26fc = auVar12._4_4_;
          fStack_26f8 = auVar12._8_4_;
          fStack_26f4 = auVar12._12_4_;
          fStack_26f0 = auVar12._16_4_;
          fStack_26ec = auVar12._20_4_;
          fStack_26e8 = auVar12._24_4_;
          fStack_26e4 = auVar12._28_4_;
          auVar33._4_4_ = fStack_26fc * 0.6933594;
          auVar33._0_4_ = local_2700 * 0.6933594;
          auVar33._8_4_ = fStack_26f8 * 0.6933594;
          auVar33._12_4_ = fStack_26f4 * 0.6933594;
          auVar33._16_4_ = fStack_26f0 * 0.6933594;
          auVar33._20_4_ = fStack_26ec * 0.6933594;
          auVar33._24_4_ = fStack_26e8 * 0.6933594;
          auVar33._28_4_ = fStack_26e4;
          auVar12 = vsubps_avx(auVar11,auVar33);
          auVar32._4_4_ = fStack_26fc * -0.00021219444;
          auVar32._0_4_ = local_2700 * -0.00021219444;
          auVar32._8_4_ = fStack_26f8 * -0.00021219444;
          auVar32._12_4_ = fStack_26f4 * -0.00021219444;
          auVar32._16_4_ = fStack_26f0 * -0.00021219444;
          auVar32._20_4_ = fStack_26ec * -0.00021219444;
          auVar32._24_4_ = fStack_26e8 * -0.00021219444;
          auVar32._28_4_ = fStack_26e4;
          auVar12 = vsubps_avx(auVar12,auVar32);
          local_3480 = auVar12._0_4_;
          fStack_347c = auVar12._4_4_;
          fStack_3478 = auVar12._8_4_;
          fStack_3474 = auVar12._12_4_;
          fStack_3470 = auVar12._16_4_;
          fStack_346c = auVar12._20_4_;
          fStack_3468 = auVar12._24_4_;
          fStack_3464 = auVar12._28_4_;
          local_3be0 = CONCAT44((int)fStack_26fc,(int)local_2700);
          uStack_3bd8 = CONCAT44((int)fStack_26f4,(int)fStack_26f8);
          uStack_3bd0 = CONCAT44((int)fStack_26ec,(int)fStack_26f0);
          uStack_3bc8 = CONCAT44((int)fStack_26e4,(int)fStack_26e8);
          auVar8._8_8_ = uStack_3bd8;
          auVar8._0_8_ = local_3be0;
          auVar5._8_8_ = 0x7f0000007f;
          auVar5._0_8_ = 0x7f0000007f;
          auVar5 = vpaddd_avx(auVar8,auVar5);
          auVar7._8_8_ = uStack_3bc8;
          auVar7._0_8_ = uStack_3bd0;
          auVar6._8_8_ = 0x7f0000007f;
          auVar6._0_8_ = 0x7f0000007f;
          auVar6 = vpaddd_avx(auVar7,auVar6);
          auVar5 = vpslld_avx(auVar5,ZEXT416(0x17));
          auVar6 = vpslld_avx(auVar6,ZEXT416(0x17));
          local_34e0 = auVar5._0_4_;
          fStack_34dc = auVar5._4_4_;
          fStack_34d8 = auVar5._8_4_;
          fStack_34d4 = auVar5._12_4_;
          fStack_34d0 = auVar6._0_4_;
          fStack_34cc = auVar6._4_4_;
          fStack_34c8 = auVar6._8_4_;
          auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          uStack_4dd8 = SUB328(ZEXT832(0),4);
          local_41e0 = auVar5._0_4_;
          fStack_41dc = auVar5._4_4_;
          fStack_41d8 = auVar5._8_4_;
          fStack_41d4 = auVar5._12_4_;
          fStack_41d0 = auVar6._0_4_;
          fStack_41cc = auVar6._4_4_;
          fStack_41c8 = auVar6._8_4_;
          fStack_41c4 = auVar6._12_4_;
          local_1020._4_4_ =
               ((((((fStack_347c * 0.00019875691 + 0.0013981999) * fStack_347c + 0.008333452) *
                   fStack_347c + 0.041665796) * fStack_347c + 0.16666666) * fStack_347c + 0.5) *
                fStack_347c * fStack_347c + fStack_347c + 1.0) * fStack_34dc + fStack_41dc;
          local_1020._0_4_ =
               ((((((local_3480 * 0.00019875691 + 0.0013981999) * local_3480 + 0.008333452) *
                   local_3480 + 0.041665796) * local_3480 + 0.16666666) * local_3480 + 0.5) *
                local_3480 * local_3480 + local_3480 + 1.0) * local_34e0 + local_41e0;
          fStack_1018 = ((((((fStack_3478 * 0.00019875691 + 0.0013981999) * fStack_3478 +
                            0.008333452) * fStack_3478 + 0.041665796) * fStack_3478 + 0.16666666) *
                          fStack_3478 + 0.5) * fStack_3478 * fStack_3478 + fStack_3478 + 1.0) *
                        fStack_34d8 + fStack_41d8;
          fStack_1014 = ((((((fStack_3474 * 0.00019875691 + 0.0013981999) * fStack_3474 +
                            0.008333452) * fStack_3474 + 0.041665796) * fStack_3474 + 0.16666666) *
                          fStack_3474 + 0.5) * fStack_3474 * fStack_3474 + fStack_3474 + 1.0) *
                        fStack_34d4 + fStack_41d4;
          uStack_1010._0_4_ =
               ((((((fStack_3470 * 0.00019875691 + 0.0013981999) * fStack_3470 + 0.008333452) *
                   fStack_3470 + 0.041665796) * fStack_3470 + 0.16666666) * fStack_3470 + 0.5) *
                fStack_3470 * fStack_3470 + fStack_3470 + 1.0) * fStack_34d0 + fStack_41d0;
          uStack_1010._4_4_ =
               ((((((fStack_346c * 0.00019875691 + 0.0013981999) * fStack_346c + 0.008333452) *
                   fStack_346c + 0.041665796) * fStack_346c + 0.16666666) * fStack_346c + 0.5) *
                fStack_346c * fStack_346c + fStack_346c + 1.0) * fStack_34cc + fStack_41cc;
          uStack_1008._0_4_ =
               ((((((fStack_3468 * 0.00019875691 + 0.0013981999) * fStack_3468 + 0.008333452) *
                   fStack_3468 + 0.041665796) * fStack_3468 + 0.16666666) * fStack_3468 + 0.5) *
                fStack_3468 * fStack_3468 + fStack_3468 + 1.0) * fStack_34c8 + fStack_41c8;
          uStack_1008._4_4_ = fStack_3464 + fStack_3464 + 1.0 + fStack_41c4;
          auVar12 = _local_1020;
          auVar14 = vcmpps_avx(_local_1020,ZEXT832(uStack_4dd8) << 0x40,2);
          uStack_1008 = auVar12._24_8_;
          auVar51._16_8_ = uStack_1010;
          auVar51._0_16_ = _local_1020;
          auVar51._24_8_ = uStack_1008;
          auVar50._8_8_ = 0x80000000800000;
          auVar50._0_8_ = 0x80000000800000;
          auVar50._16_8_ = 0x80000000800000;
          auVar50._24_8_ = 0x80000000800000;
          auVar12 = vmaxps_avx(auVar51,auVar50);
          auVar5 = vpsrld_avx(auVar12._0_16_,ZEXT416(0x17));
          auVar6 = vpsrld_avx(auVar12._16_16_,ZEXT416(0x17));
          auVar55._8_8_ = 0x807fffff807fffff;
          auVar55._0_8_ = 0x807fffff807fffff;
          auVar55._16_8_ = 0x807fffff807fffff;
          auVar55._24_8_ = 0x807fffff807fffff;
          auVar12 = vandps_avx(auVar12,auVar55);
          auVar59._8_8_ = 0x3f0000003f000000;
          auVar59._0_8_ = 0x3f0000003f000000;
          auVar59._16_8_ = 0x3f0000003f000000;
          auVar59._24_8_ = 0x3f0000003f000000;
          auVar13 = vorps_avx(auVar12,auVar59);
          auVar62._8_8_ = 0x7f0000007f;
          auVar62._0_8_ = 0x7f0000007f;
          auVar5 = vpsubd_avx(auVar5,auVar62);
          auVar61._8_8_ = 0x7f0000007f;
          auVar61._0_8_ = 0x7f0000007f;
          auVar6 = vpsubd_avx(auVar6,auVar61);
          local_140 = auVar6._0_8_;
          uStack_138 = auVar6._8_8_;
          auVar60._16_8_ = local_140;
          auVar60._0_16_ = auVar5;
          auVar60._24_8_ = uStack_138;
          auVar12 = vcvtdq2ps_avx(auVar60);
          local_900 = auVar12._0_4_;
          fStack_8fc = auVar12._4_4_;
          fStack_8f8 = auVar12._8_4_;
          fStack_8f4 = auVar12._12_4_;
          fStack_8f0 = auVar12._16_4_;
          fStack_8ec = auVar12._20_4_;
          fStack_8e8 = auVar12._24_4_;
          fStack_8e4 = auVar12._28_4_;
          local_10a0._4_4_ = fStack_8fc + 1.0;
          local_10a0._0_4_ = local_900 + 1.0;
          fStack_1098 = fStack_8f8 + 1.0;
          fStack_1094 = fStack_8f4 + 1.0;
          uStack_1090._0_4_ = fStack_8f0 + 1.0;
          uStack_1090._4_4_ = fStack_8ec + 1.0;
          uStack_1088._0_4_ = fStack_8e8 + 1.0;
          uStack_1088._4_4_ = fStack_8e4 + 1.0;
          auVar24 = _local_10a0;
          auVar11 = vcmpps_avx(auVar13,_DAT_01f09ca0,1);
          auVar12 = vandps_avx(auVar13,auVar11);
          auVar53._8_8_ = 0x3f8000003f800000;
          auVar53._0_8_ = 0x3f8000003f800000;
          auVar53._16_8_ = 0x3f8000003f800000;
          auVar53._24_8_ = 0x3f8000003f800000;
          auVar13 = vsubps_avx(auVar13,auVar53);
          uStack_1088 = auVar24._24_8_;
          auVar54._8_8_ = 0x3f8000003f800000;
          auVar54._0_8_ = 0x3f8000003f800000;
          auVar54._16_8_ = 0x3f8000003f800000;
          auVar54._24_8_ = 0x3f8000003f800000;
          auVar11 = vandps_avx(auVar54,auVar11);
          auVar52._16_8_ = uStack_1090;
          auVar52._0_16_ = _local_10a0;
          auVar52._24_8_ = uStack_1088;
          auVar11 = vsubps_avx(auVar52,auVar11);
          local_940 = auVar13._0_4_;
          fStack_93c = auVar13._4_4_;
          fStack_938 = auVar13._8_4_;
          fStack_934 = auVar13._12_4_;
          fStack_930 = auVar13._16_4_;
          fStack_92c = auVar13._20_4_;
          fStack_928 = auVar13._24_4_;
          fStack_924 = auVar13._28_4_;
          local_960 = auVar12._0_4_;
          fStack_95c = auVar12._4_4_;
          fStack_958 = auVar12._8_4_;
          fStack_954 = auVar12._12_4_;
          fStack_950 = auVar12._16_4_;
          fStack_94c = auVar12._20_4_;
          fStack_948 = auVar12._24_4_;
          fStack_944 = auVar12._28_4_;
          local_940 = local_940 + local_960;
          fStack_93c = fStack_93c + fStack_95c;
          fStack_938 = fStack_938 + fStack_958;
          fStack_934 = fStack_934 + fStack_954;
          fStack_930 = fStack_930 + fStack_950;
          fStack_92c = fStack_92c + fStack_94c;
          fStack_928 = fStack_928 + fStack_948;
          fStack_924 = fStack_924 + fStack_944;
          local_6c0 = auVar11._0_4_;
          fStack_6bc = auVar11._4_4_;
          fStack_6b8 = auVar11._8_4_;
          fStack_6b4 = auVar11._12_4_;
          fStack_6b0 = auVar11._16_4_;
          fStack_6ac = auVar11._20_4_;
          fStack_6a8 = auVar11._24_4_;
          local_1120._4_4_ =
               fStack_6bc * -0.00021219444 +
               ((((((((fStack_93c * 0.070376836 + -0.1151461) * fStack_93c + 0.116769984) *
                     fStack_93c + -0.12420141) * fStack_93c + 0.14249323) * fStack_93c + -0.16668057
                  ) * fStack_93c + 0.20000714) * fStack_93c + -0.24999994) * fStack_93c + 0.3333333)
               * fStack_93c * fStack_93c * fStack_93c;
          local_1120._0_4_ =
               local_6c0 * -0.00021219444 +
               ((((((((local_940 * 0.070376836 + -0.1151461) * local_940 + 0.116769984) * local_940
                    + -0.12420141) * local_940 + 0.14249323) * local_940 + -0.16668057) * local_940
                 + 0.20000714) * local_940 + -0.24999994) * local_940 + 0.3333333) * local_940 *
               local_940 * local_940;
          fStack_1118 = fStack_6b8 * -0.00021219444 +
                        ((((((((fStack_938 * 0.070376836 + -0.1151461) * fStack_938 + 0.116769984) *
                              fStack_938 + -0.12420141) * fStack_938 + 0.14249323) * fStack_938 +
                           -0.16668057) * fStack_938 + 0.20000714) * fStack_938 + -0.24999994) *
                         fStack_938 + 0.3333333) * fStack_938 * fStack_938 * fStack_938;
          fStack_1114 = fStack_6b4 * -0.00021219444 +
                        ((((((((fStack_934 * 0.070376836 + -0.1151461) * fStack_934 + 0.116769984) *
                              fStack_934 + -0.12420141) * fStack_934 + 0.14249323) * fStack_934 +
                           -0.16668057) * fStack_934 + 0.20000714) * fStack_934 + -0.24999994) *
                         fStack_934 + 0.3333333) * fStack_934 * fStack_934 * fStack_934;
          uStack_1110._0_4_ =
               fStack_6b0 * -0.00021219444 +
               ((((((((fStack_930 * 0.070376836 + -0.1151461) * fStack_930 + 0.116769984) *
                     fStack_930 + -0.12420141) * fStack_930 + 0.14249323) * fStack_930 + -0.16668057
                  ) * fStack_930 + 0.20000714) * fStack_930 + -0.24999994) * fStack_930 + 0.3333333)
               * fStack_930 * fStack_930 * fStack_930;
          uStack_1110._4_4_ =
               fStack_6ac * -0.00021219444 +
               ((((((((fStack_92c * 0.070376836 + -0.1151461) * fStack_92c + 0.116769984) *
                     fStack_92c + -0.12420141) * fStack_92c + 0.14249323) * fStack_92c + -0.16668057
                  ) * fStack_92c + 0.20000714) * fStack_92c + -0.24999994) * fStack_92c + 0.3333333)
               * fStack_92c * fStack_92c * fStack_92c;
          uStack_1108._0_4_ =
               fStack_6a8 * -0.00021219444 +
               ((((((((fStack_928 * 0.070376836 + -0.1151461) * fStack_928 + 0.116769984) *
                     fStack_928 + -0.12420141) * fStack_928 + 0.14249323) * fStack_928 + -0.16668057
                  ) * fStack_928 + 0.20000714) * fStack_928 + -0.24999994) * fStack_928 + 0.3333333)
               * fStack_928 * fStack_928 * fStack_928;
          uStack_1108._4_4_ = fStack_924 + 0.3333333 + -0.00021219444;
          auVar12 = _local_1120;
          uStack_1108 = auVar12._24_8_;
          auVar57._16_8_ = uStack_1110;
          auVar57._0_16_ = _local_1120;
          auVar57._24_8_ = uStack_1108;
          auVar56._4_4_ = fStack_93c * fStack_93c * 0.5;
          auVar56._0_4_ = local_940 * local_940 * 0.5;
          auVar56._8_4_ = fStack_938 * fStack_938 * 0.5;
          auVar56._12_4_ = fStack_934 * fStack_934 * 0.5;
          auVar56._16_4_ = fStack_930 * fStack_930 * 0.5;
          auVar56._20_4_ = fStack_92c * fStack_92c * 0.5;
          auVar56._24_4_ = fStack_928 * fStack_928 * 0.5;
          auVar56._28_4_ = fStack_924;
          auVar12 = vsubps_avx(auVar57,auVar56);
          local_9a0 = auVar12._0_4_;
          fStack_99c = auVar12._4_4_;
          fStack_998 = auVar12._8_4_;
          fStack_994 = auVar12._12_4_;
          fStack_990 = auVar12._16_4_;
          fStack_98c = auVar12._20_4_;
          fStack_988 = auVar12._24_4_;
          fStack_984 = auVar12._28_4_;
          local_1020._4_4_ = fStack_6bc * 0.6933594 + fStack_93c + fStack_99c;
          local_1020._0_4_ = local_6c0 * 0.6933594 + local_940 + local_9a0;
          fStack_1018 = fStack_6b8 * 0.6933594 + fStack_938 + fStack_998;
          fStack_1014 = fStack_6b4 * 0.6933594 + fStack_934 + fStack_994;
          uStack_1010._0_4_ = fStack_6b0 * 0.6933594 + fStack_930 + fStack_990;
          uStack_1010._4_4_ = fStack_6ac * 0.6933594 + fStack_92c + fStack_98c;
          uStack_1008._0_4_ = fStack_6a8 * 0.6933594 + fStack_928 + fStack_988;
          uStack_1008._4_4_ = fStack_924 + fStack_984 + 0.6933594;
          auVar12 = _local_1020;
          uStack_1008 = auVar12._24_8_;
          auVar58._16_8_ = uStack_1010;
          auVar58._0_16_ = _local_1020;
          auVar58._24_8_ = uStack_1008;
          auVar12 = vorps_avx(auVar58,auVar14);
          auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          uStack_1f90 = auVar6._0_8_;
          uStack_1f88 = auVar6._8_8_;
          auVar6 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x30);
          auVar7 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x30);
          local_20e0 = auVar12._0_4_;
          fStack_20dc = auVar12._4_4_;
          fStack_20d8 = auVar12._8_4_;
          fStack_20d4 = auVar12._12_4_;
          fStack_20d0 = auVar12._16_4_;
          fStack_20cc = auVar12._20_4_;
          fStack_20c8 = auVar12._24_4_;
          uStack_20c4 = auVar12._28_4_;
          local_2100 = auVar6._0_4_;
          fStack_20fc = auVar6._4_4_;
          fStack_20f8 = auVar6._8_4_;
          fStack_20f4 = auVar6._12_4_;
          fStack_20f0 = auVar7._0_4_;
          fStack_20ec = auVar7._4_4_;
          fStack_20e8 = auVar7._8_4_;
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
          uStack_1fd0 = auVar7._0_8_;
          uStack_1fc8 = auVar7._8_8_;
          auVar42._4_4_ = fStack_20dc * fStack_20fc;
          auVar42._0_4_ = local_20e0 * local_2100;
          auVar42._12_4_ = fStack_20d4 * fStack_20f4;
          auVar42._8_4_ = fStack_20d8 * fStack_20f8;
          auVar42._20_4_ = fStack_20cc * fStack_20ec;
          auVar42._16_4_ = fStack_20d0 * fStack_20f0;
          auVar42._28_4_ = uStack_20c4;
          auVar42._24_4_ = fStack_20c8 * fStack_20e8;
          auVar12 = vsubps_avx(ZEXT832(uStack_4dd8) << 0x40,auVar42);
          auVar41._8_8_ = 0x42b0c0a542b0c0a5;
          auVar41._0_8_ = 0x42b0c0a542b0c0a5;
          auVar41._16_8_ = 0x42b0c0a542b0c0a5;
          auVar41._24_8_ = 0x42b0c0a542b0c0a5;
          auVar12 = vminps_avx(auVar12,auVar41);
          auVar40._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar40._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar40._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar40._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar11 = vmaxps_avx(auVar12,auVar40);
          local_1900 = auVar11._0_4_;
          fStack_18fc = auVar11._4_4_;
          fStack_18f8 = auVar11._8_4_;
          fStack_18f4 = auVar11._12_4_;
          fStack_18f0 = auVar11._16_4_;
          fStack_18ec = auVar11._20_4_;
          fStack_18e8 = auVar11._24_4_;
          local_1e40._4_4_ = fStack_18fc * 1.442695 + 0.5;
          local_1e40._0_4_ = local_1900 * 1.442695 + 0.5;
          fStack_1e38 = fStack_18f8 * 1.442695 + 0.5;
          fStack_1e34 = fStack_18f4 * 1.442695 + 0.5;
          fStack_1e30 = fStack_18f0 * 1.442695 + 0.5;
          fStack_1e2c = fStack_18ec * 1.442695 + 0.5;
          fStack_1e28 = fStack_18e8 * 1.442695 + 0.5;
          uStack_1e24 = 0x3ff8aa3b;
          auVar14 = vroundps_avx(_local_1e40,1);
          auVar12 = vcmpps_avx(_local_1e40,auVar14,1);
          auVar45._8_8_ = 0x3f8000003f800000;
          auVar45._0_8_ = 0x3f8000003f800000;
          auVar45._16_8_ = 0x3f8000003f800000;
          auVar45._24_8_ = 0x3f8000003f800000;
          auVar12 = vandps_avx(auVar12,auVar45);
          auVar12 = vsubps_avx(auVar14,auVar12);
          local_1400 = auVar12._0_4_;
          fStack_13fc = auVar12._4_4_;
          fStack_13f8 = auVar12._8_4_;
          fStack_13f4 = auVar12._12_4_;
          fStack_13f0 = auVar12._16_4_;
          fStack_13ec = auVar12._20_4_;
          fStack_13e8 = auVar12._24_4_;
          fStack_13e4 = auVar12._28_4_;
          auVar47._4_4_ = fStack_13fc * 0.6933594;
          auVar47._0_4_ = local_1400 * 0.6933594;
          auVar47._8_4_ = fStack_13f8 * 0.6933594;
          auVar47._12_4_ = fStack_13f4 * 0.6933594;
          auVar47._16_4_ = fStack_13f0 * 0.6933594;
          auVar47._20_4_ = fStack_13ec * 0.6933594;
          auVar47._24_4_ = fStack_13e8 * 0.6933594;
          auVar47._28_4_ = fStack_13e4;
          auVar12 = vsubps_avx(auVar11,auVar47);
          auVar46._4_4_ = fStack_13fc * -0.00021219444;
          auVar46._0_4_ = local_1400 * -0.00021219444;
          auVar46._8_4_ = fStack_13f8 * -0.00021219444;
          auVar46._12_4_ = fStack_13f4 * -0.00021219444;
          auVar46._16_4_ = fStack_13f0 * -0.00021219444;
          auVar46._20_4_ = fStack_13ec * -0.00021219444;
          auVar46._24_4_ = fStack_13e8 * -0.00021219444;
          auVar46._28_4_ = fStack_13e4;
          auVar12 = vsubps_avx(auVar12,auVar46);
          local_1700 = auVar12._0_4_;
          fStack_16fc = auVar12._4_4_;
          fStack_16f8 = auVar12._8_4_;
          fStack_16f4 = auVar12._12_4_;
          fStack_16f0 = auVar12._16_4_;
          fStack_16ec = auVar12._20_4_;
          fStack_16e8 = auVar12._24_4_;
          fStack_16e4 = auVar12._28_4_;
          local_1e60 = CONCAT44((int)fStack_13fc,(int)local_1400);
          uStack_1e58 = CONCAT44((int)fStack_13f4,(int)fStack_13f8);
          uStack_1e50 = CONCAT44((int)fStack_13ec,(int)fStack_13f0);
          uStack_1e48 = CONCAT44((int)fStack_13e4,(int)fStack_13e8);
          auVar49._8_8_ = uStack_1e58;
          auVar49._0_8_ = local_1e60;
          auVar48._8_8_ = 0x7f0000007f;
          auVar48._0_8_ = 0x7f0000007f;
          auVar8 = vpaddd_avx(auVar49,auVar48);
          auVar10._8_8_ = uStack_1e48;
          auVar10._0_8_ = uStack_1e50;
          auVar9._8_8_ = 0x7f0000007f;
          auVar9._0_8_ = 0x7f0000007f;
          auVar9 = vpaddd_avx(auVar10,auVar9);
          auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
          auVar9 = vpslld_avx(auVar9,ZEXT416(0x17));
          local_1760 = auVar8._0_4_;
          fStack_175c = auVar8._4_4_;
          fStack_1758 = auVar8._8_4_;
          fStack_1754 = auVar8._12_4_;
          fStack_1750 = auVar9._0_4_;
          fStack_174c = auVar9._4_4_;
          fStack_1748 = auVar9._8_4_;
          local_2020 = auVar6._0_4_;
          fStack_201c = auVar6._4_4_;
          fStack_2018 = auVar6._8_4_;
          fStack_2014 = auVar6._12_4_;
          fStack_2010 = auVar7._0_4_;
          fStack_200c = auVar7._4_4_;
          fStack_2008 = auVar7._8_4_;
          fStack_2004 = auVar7._12_4_;
          auVar39._16_8_ = uStack_1fd0;
          auVar39._0_16_ = auVar6;
          auVar39._24_8_ = uStack_1fc8;
          auVar38._4_4_ =
               fStack_201c +
               (((((fStack_16fc * (fStack_16fc * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16fc + 0.041665796) * fStack_16fc + 0.16666666) * fStack_16fc + 0.5) *
                fStack_16fc * fStack_16fc + fStack_16fc + 1.0) * fStack_175c;
          auVar38._0_4_ =
               local_2020 +
               (((((local_1700 * (local_1700 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   local_1700 + 0.041665796) * local_1700 + 0.16666666) * local_1700 + 0.5) *
                local_1700 * local_1700 + local_1700 + 1.0) * local_1760;
          auVar38._8_4_ =
               fStack_2018 +
               (((((fStack_16f8 * (fStack_16f8 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16f8 + 0.041665796) * fStack_16f8 + 0.16666666) * fStack_16f8 + 0.5) *
                fStack_16f8 * fStack_16f8 + fStack_16f8 + 1.0) * fStack_1758;
          auVar38._12_4_ =
               fStack_2014 +
               (((((fStack_16f4 * (fStack_16f4 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16f4 + 0.041665796) * fStack_16f4 + 0.16666666) * fStack_16f4 + 0.5) *
                fStack_16f4 * fStack_16f4 + fStack_16f4 + 1.0) * fStack_1754;
          auVar38._16_4_ =
               fStack_2010 +
               (((((fStack_16f0 * (fStack_16f0 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16f0 + 0.041665796) * fStack_16f0 + 0.16666666) * fStack_16f0 + 0.5) *
                fStack_16f0 * fStack_16f0 + fStack_16f0 + 1.0) * fStack_1750;
          auVar38._20_4_ =
               fStack_200c +
               (((((fStack_16ec * (fStack_16ec * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16ec + 0.041665796) * fStack_16ec + 0.16666666) * fStack_16ec + 0.5) *
                fStack_16ec * fStack_16ec + fStack_16ec + 1.0) * fStack_174c;
          auVar38._24_4_ =
               fStack_2008 +
               (((((fStack_16e8 * (fStack_16e8 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16e8 + 0.041665796) * fStack_16e8 + 0.16666666) * fStack_16e8 + 0.5) *
                fStack_16e8 * fStack_16e8 + fStack_16e8 + 1.0) * fStack_1748;
          auVar38._28_4_ = fStack_2004 + fStack_16e4 + fStack_16e4 + 1.0;
          auVar12 = vdivps_avx(auVar39,auVar38);
          local_2120 = auVar12._0_4_;
          fStack_211c = auVar12._4_4_;
          fStack_2118 = auVar12._8_4_;
          fStack_2114 = auVar12._12_4_;
          fStack_2110 = auVar12._16_4_;
          fStack_210c = auVar12._20_4_;
          fStack_2108 = auVar12._24_4_;
          auVar44._4_4_ = fStack_211c * fStack_20fc;
          auVar44._0_4_ = local_2120 * local_2100;
          auVar44._8_4_ = fStack_2118 * fStack_20f8;
          auVar44._12_4_ = fStack_2114 * fStack_20f4;
          auVar44._16_4_ = fStack_2110 * fStack_20f0;
          auVar44._20_4_ = fStack_210c * fStack_20ec;
          auVar44._24_4_ = fStack_2108 * fStack_20e8;
          auVar44._28_4_ = auVar12._28_4_;
          auVar43._16_8_ = uStack_1f90;
          auVar43._0_16_ = auVar5;
          auVar43._24_8_ = uStack_1f88;
          auVar12 = vsubps_avx(auVar44,auVar43);
          uStack_4164 = (undefined4)((ulong)uStack_4b68 >> 0x20);
          local_41a0 = auVar12._0_4_;
          fStack_419c = auVar12._4_4_;
          fStack_4198 = auVar12._8_4_;
          fStack_4194 = auVar12._12_4_;
          fStack_4190 = auVar12._16_4_;
          fStack_418c = auVar12._20_4_;
          fStack_4188 = auVar12._24_4_;
          local_46c0._4_4_ = fStack_417c * fStack_419c;
          local_46c0._0_4_ = local_4180 * local_41a0;
          uStack_46b8._0_4_ = fStack_4178 * fStack_4198;
          uStack_46b8._4_4_ = fStack_4174 * fStack_4194;
          uStack_46b0._0_4_ = fStack_4170 * fStack_4190;
          uStack_46b0._4_4_ = fStack_416c * fStack_418c;
          uStack_46a8._0_4_ = fStack_4168 * fStack_4188;
          uStack_46a8._4_4_ = uStack_4164;
          break;
        case 6:
          uVar1 = *(uint *)*plVar15;
          auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
          auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
          uVar1 = *(uint *)(*plVar15 + 4);
          auVar7 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x30);
          auVar8 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar1),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar1),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
          auVar10 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3f800000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3f800000),0x30);
          uStack_3ed0 = auVar10._0_8_;
          uStack_3ec8 = auVar10._8_8_;
          local_4000 = auVar5._0_4_;
          fStack_3ffc = auVar5._4_4_;
          fStack_3ff8 = auVar5._8_4_;
          fStack_3ff4 = auVar5._12_4_;
          fStack_3ff0 = auVar6._0_4_;
          fStack_3fec = auVar6._4_4_;
          fStack_3fe8 = auVar6._8_4_;
          fStack_3fe4 = auVar6._12_4_;
          local_4040 = auVar7._0_4_;
          fStack_403c = auVar7._4_4_;
          fStack_4038 = auVar7._8_4_;
          fStack_4034 = auVar7._12_4_;
          fStack_4030 = auVar8._0_4_;
          fStack_402c = auVar8._4_4_;
          fStack_4028 = auVar8._8_4_;
          fStack_4024 = auVar8._12_4_;
          local_4120._4_4_ = fStack_417c * fStack_3ffc + fStack_403c;
          local_4120._0_4_ = local_4180 * local_4000 + local_4040;
          fStack_4118 = fStack_4178 * fStack_3ff8 + fStack_4038;
          fStack_4114 = fStack_4174 * fStack_3ff4 + fStack_4034;
          uStack_4110._0_4_ = fStack_4170 * fStack_3ff0 + fStack_4030;
          uStack_4110._4_4_ = fStack_416c * fStack_3fec + fStack_402c;
          uStack_4108._0_4_ = fStack_4168 * fStack_3fe8 + fStack_4028;
          uStack_4108._4_4_ = fStack_3fe4 + fStack_4024;
          auVar12 = _local_4120;
          uStack_4108 = auVar12._24_8_;
          auVar12._16_8_ = uStack_4110;
          auVar12._0_16_ = _local_4120;
          auVar12._24_8_ = uStack_4108;
          auVar12 = vmaxps_avx(auVar12,ZEXT832(0));
          auVar11._16_8_ = uStack_3ed0;
          auVar11._0_16_ = auVar9;
          auVar11._24_8_ = uStack_3ec8;
          auVar12 = vminps_avx(auVar12,auVar11);
          local_3fa0 = auVar12._0_4_;
          fStack_3f9c = auVar12._4_4_;
          fStack_3f98 = auVar12._8_4_;
          fStack_3f94 = auVar12._12_4_;
          fStack_3f90 = auVar12._16_4_;
          fStack_3f8c = auVar12._20_4_;
          fStack_3f88 = auVar12._24_4_;
          uStack_3f84 = auVar12._28_4_;
          local_46c0._4_4_ = fStack_3f9c * fStack_417c;
          local_46c0._0_4_ = local_3fa0 * local_4180;
          uStack_46b8._0_4_ = fStack_3f98 * fStack_4178;
          uStack_46b8._4_4_ = fStack_3f94 * fStack_4174;
          uStack_46b0._0_4_ = fStack_3f90 * fStack_4170;
          uStack_46b0._4_4_ = fStack_3f8c * fStack_416c;
          uStack_46a8._0_4_ = fStack_3f88 * fStack_4168;
          uStack_46a8._4_4_ = uStack_3f84;
          break;
        default:
          uStack_46b8 = uStack_4b78;
          local_46c0 = (undefined1  [8])local_4b80;
          uStack_46b0 = uStack_4b70;
          uStack_46a8 = uStack_4b68;
        }
        *local_4ad8 = _local_46c0;
        local_4ad8 = local_4ad8 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack1to8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m256 _sum = _mm256_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm256_loadu_ps(bias_data_ptr + p * 8);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        const float* sptr = m.row(sy);

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            float val = sptr[sx];

                            int k = y * kernel_w + x;

                            __m256 _val = _mm256_set1_ps(val);
                            __m256 _w = _mm256_load_ps(kptr + k * 8);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 8;
                }

                _sum = activation_avx(_sum, activation_type, activation_params);

                _mm256_storeu_ps(outptr, _sum);
                outptr += 8;
            }
        }
    }
}